

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<long,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToMonthsOperator>
               (long *ldata,interval_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  duckdb *pdVar2;
  long *plVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  idx_t iVar8;
  int64_t *piVar9;
  ulong uVar10;
  ulong uVar11;
  ValidityMask *pVVar12;
  ulong uVar13;
  unsigned_long uVar14;
  undefined1 auVar15 [16];
  int64_t *local_98;
  idx_t local_90;
  ValidityMask *local_88;
  long *local_80;
  ulong local_78;
  idx_t local_70;
  string local_68;
  ulong local_40;
  long *local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_88 = mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_98 = &result_data->micros;
      iVar8 = 0;
      do {
        pdVar2 = (duckdb *)ldata[iVar8];
        bVar6 = TryCast::Operation<long,int>((int64_t)pdVar2,(int32_t *)&local_90,false);
        if (!bVar6) {
          auVar15 = __cxa_allocate_exception(0x10);
          CastExceptionText<long,int>(&local_68,pdVar2,auVar15._8_8_);
          InvalidInputException::InvalidInputException(auVar15._0_8_,&local_68);
          __cxa_throw(auVar15._0_8_,&InvalidInputException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        ((interval_t *)(local_98 + -1))->months = (int)(local_90 & 0xffffffff);
        ((interval_t *)(local_98 + -1))->days = (int)((local_90 & 0xffffffff) >> 0x20);
        *local_98 = 0;
        iVar8 = iVar8 + 1;
        local_98 = local_98 + 2;
      } while (count != iVar8);
    }
  }
  else {
    local_70 = count;
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_90 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_68,(unsigned_long **)mask,&local_90);
      sVar5 = local_68._M_string_length;
      _Var4._M_p = local_68._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var4._M_p;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
      }
      pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar7->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      count = local_70;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_78 = count + 0x3f >> 6;
      local_40 = 0;
      uVar11 = 0;
      pVVar12 = local_88;
      local_80 = ldata;
      do {
        plVar3 = local_80;
        puVar1 = (pVVar12->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar14 = 0xffffffffffffffff;
        }
        else {
          uVar14 = puVar1[local_40];
        }
        uVar13 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar13 = count;
        }
        uVar10 = uVar13;
        if (uVar14 != 0) {
          uVar10 = uVar11;
          if (uVar14 == 0xffffffffffffffff) {
            if (uVar11 < uVar13) {
              piVar9 = &result_data[uVar11].micros;
              do {
                pdVar2 = (duckdb *)plVar3[uVar11];
                bVar6 = TryCast::Operation<long,int>((int64_t)pdVar2,(int32_t *)&local_90,false);
                if (!bVar6) {
                  auVar15 = __cxa_allocate_exception(0x10);
                  CastExceptionText<long,int>(&local_68,pdVar2,auVar15._8_8_);
                  InvalidInputException::InvalidInputException(auVar15._0_8_,&local_68);
                  __cxa_throw(auVar15._0_8_,&InvalidInputException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
                ((interval_t *)(piVar9 + -1))->months = (int)(local_90 & 0xffffffff);
                ((interval_t *)(piVar9 + -1))->days = (int)((local_90 & 0xffffffff) >> 0x20);
                *piVar9 = 0;
                uVar11 = uVar11 + 1;
                piVar9 = piVar9 + 2;
                uVar10 = uVar11;
              } while (uVar13 != uVar11);
            }
          }
          else {
            pVVar12 = local_88;
            if (uVar11 < uVar13) {
              piVar9 = &result_data[uVar11].micros;
              local_38 = local_80 + uVar11;
              uVar10 = 0;
              do {
                if ((uVar14 >> (uVar10 & 0x3f) & 1) != 0) {
                  pdVar2 = (duckdb *)local_38[uVar10];
                  bVar6 = TryCast::Operation<long,int>((int64_t)pdVar2,(int32_t *)&local_90,false);
                  if (!bVar6) {
                    auVar15 = __cxa_allocate_exception(0x10);
                    CastExceptionText<long,int>(&local_68,pdVar2,auVar15._8_8_);
                    InvalidInputException::InvalidInputException(auVar15._0_8_,&local_68);
                    __cxa_throw(auVar15._0_8_,&InvalidInputException::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  ((interval_t *)(piVar9 + -1))->months = (int)(local_90 & 0xffffffff);
                  ((interval_t *)(piVar9 + -1))->days = (int)((local_90 & 0xffffffff) >> 0x20);
                  *piVar9 = 0;
                }
                uVar10 = uVar10 + 1;
                piVar9 = piVar9 + 2;
              } while ((uVar11 - uVar13) + uVar10 != 0);
              uVar10 = uVar11 + uVar10;
              pVVar12 = local_88;
            }
          }
        }
        local_40 = local_40 + 1;
        count = local_70;
        uVar11 = uVar10;
      } while (local_40 != local_78);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}